

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

string * __thiscall
BasePort::GetFpgaVersionMajorString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,uchar boardId)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"FPGA_V",&local_11);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::GetFpgaVersionMajorString(unsigned char boardId) const
{
    unsigned int fpga_ver = GetFpgaVersionMajor(boardId);
    std::string fStr("FPGA_V");
    if (fpga_ver == 0)
        fStr.push_back('?');
    else
        fStr.push_back('0'+fpga_ver);
    return fStr;
}